

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

string * __thiscall
smf::MidiFile::base64Encode(string *__return_storage_ptr__,MidiFile *this,string *input)

{
  bool bVar1;
  ulong uVar2;
  char cVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_58;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  int valb;
  int vala;
  string *input_local;
  MidiFile *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __range1._4_4_ = -6;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_58._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa8);
    cVar3 = (char)__return_storage_ptr__;
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&__end1);
    for (__range1._4_4_ = __range1._4_4_ + 8; -1 < __range1._4_4_;
        __range1._4_4_ = __range1._4_4_ + -6) {
      std::__cxx11::string::operator[](0x168bd0);
      std::__cxx11::string::push_back(cVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  if (-6 < __range1._4_4_) {
    std::__cxx11::string::operator[](0x168bd0);
    std::__cxx11::string::push_back(cVar3);
  }
  while (uVar2 = std::__cxx11::string::size(), (uVar2 & 3) != 0) {
    std::__cxx11::string::back();
    std::__cxx11::string::push_back(cVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::base64Encode(const std::string& input) {
	std::string output;
	output.reserve(((input.size()/3) + (input.size() % 3 > 0)) * 4);
	int vala = 0;
	int valb = -6;
	for (uchar c : input) {
		vala = (vala << 8) + c;
		valb += 8;
		while (valb >=0) {
			output.push_back(MidiFile::encodeLookup[(vala >> valb) & 0x3F]);
			valb -= 6;
		}
	}
	if (valb > -6) {
		output.push_back(MidiFile::encodeLookup[((vala << 8) >> (valb + 8)) & 0x3F]);
	}
	while (output.size() % 4) {
		output.push_back(MidiFile::encodeLookup.back());
	}
	return output;
}